

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

void __thiscall
qclab::dense::SquareMatrix<std::complex<float>_>::SquareMatrix
          (SquareMatrix<std::complex<float>_> *this,SquareMatrix<std::complex<float>_> *matrix)

{
  long lVar1;
  complex<float> *pcVar2;
  int64_t i;
  ulong uVar3;
  
  lVar1 = matrix->size_;
  this->size_ = lVar1;
  alloc_unique_array<std::complex<float>>((dense *)&this->data_,lVar1 * lVar1);
  pcVar2 = (matrix->data_)._M_t.
           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
           _M_t.
           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
           .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  for (uVar3 = 0; uVar3 < (ulong)(this->size_ * this->size_); uVar3 = uVar3 + 1) {
    (this->data_)._M_t.
    super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
    super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
    super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl[uVar3]._M_value =
         pcVar2[uVar3]._M_value;
  }
  return;
}

Assistant:

SquareMatrix( const SquareMatrix< T >& matrix )
        : size_( matrix.size() )
        , data_( alloc_unique_array< T >( size_ * size_ ) )
        {
          const T* data = matrix.ptr() ;
          #pragma omp parallel for
          for ( int64_t i = 0; i < size_*size_; i++ ) {
            data_[i] = data[i] ;
          }
        }